

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Sampling_Linear_Test::~Sampling_Linear_Test(Sampling_Linear_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Sampling, Linear) {
    int nBuckets = 32;
    std::vector<int> buckets(nBuckets, 0);

    int ranges[][2] = {{0, 1}, {1, 2}, {5, 50}, {100, 0}, {75, 50}};
    for (const auto r : ranges) {
        Float f0 = r[0], f1 = r[1];
        int nSamples = 1000000;
        for (int i = 0; i < nSamples; ++i) {
            Float u = (i + .5) / nSamples;
            Float t = SampleLinear(u, f0, f1);
            ++buckets[std::min<int>(t * nBuckets, nBuckets - 1)];
        }

        for (int i = 0; i < nBuckets; ++i) {
            int expected =
                Lerp(Float(i) / (nBuckets - 1), buckets[0], buckets[nBuckets - 1]);
            EXPECT_GE(buckets[i], .99 * expected);
            EXPECT_LE(buckets[i], 1.01 * expected);
        }
    }

    auto lin = [](Float v) { return 1 + 3 * v; };
    auto values = Sample1DFunction(lin, 1024, 64 * 1024, 0.f, 1.f);
    PiecewiseConstant1D distrib(values);
    for (Float u : Uniform1D(100)) {
        Float cx = SampleLinear(u, 1, 4);
        Float cp = LinearPDF(cx, 1, 4);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }

    RNG rng;
    for (Float u : Uniform1D(100)) {
        Float low = rng.Uniform<Float>() * 10;
        Float high = rng.Uniform<Float>() * 10;
        if (low < high)
            pstd::swap(low, high);
        Float x = SampleLinear(u, low, high);

        auto checkErr = [](Float a, Float b) {
            Float err;
            if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                err = std::abs(a - b);
            else
                err = std::abs(2 * (a - b) / (a + b));
            return err > 1e-2;
        };

        EXPECT_FALSE(checkErr(u, InvertLinearSample(x, low, high)))
            << " u = " << u << " -> x " << x << " -> " << InvertLinearSample(x, low, high)
            << " (over " << low << " - " << high;
    }
}